

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operation.cpp
# Opt level: O0

ptr<Value> __thiscall Operation::asBooleans(Operation *this,bool leftOperand,bool rightOperand)

{
  ThrowPacket *this_00;
  byte in_CL;
  undefined7 in_register_00000031;
  allocator<char> local_51;
  string local_50;
  ptr<Value> local_30;
  byte local_1a;
  undefined1 local_19;
  bool rightOperand_local;
  undefined8 uStack_18;
  bool leftOperand_local;
  Operation *this_local;
  
  uStack_18 = CONCAT71(in_register_00000031,leftOperand);
  local_1a = in_CL & 1;
  local_19 = rightOperand;
  this_local = this;
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Operation not defined for Boolean type",&local_51);
  ExceptionObjects::undefined_operation((ExceptionObjects *)&local_30,&local_50);
  ThrowPacket::ThrowPacket(this_00,&local_30);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
}

Assistant:

ptr<Value> Operation::asBooleans(bool leftOperand, bool rightOperand) {
    throw ThrowPacket(ExceptionObjects::undefined_operation("Operation not defined for Boolean type"));
}